

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCoordsys.h
# Opt level: O2

ChVector<double> * __thiscall
chrono::ChCoordsys<double>::TransformLocalToParent
          (ChVector<double> *__return_storage_ptr__,ChCoordsys<double> *this,ChVector<double> *local
          )

{
  double dVar1;
  ChVector<double> *v;
  double local_38;
  double dStack_30;
  double local_28;
  
  ChQuaternion<double>::Rotate(&this->rot,local);
  dVar1 = (this->pos).m_data[1];
  __return_storage_ptr__->m_data[0] = (this->pos).m_data[0] + local_38;
  __return_storage_ptr__->m_data[1] = dVar1 + dStack_30;
  __return_storage_ptr__->m_data[2] = (this->pos).m_data[2] + local_28;
  return __return_storage_ptr__;
}

Assistant:

ChVector<Real> TransformLocalToParent(const ChVector<Real>& local) const { return pos + rot.Rotate(local); }